

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O2

void I_FreezeTimePolled(bool frozen)

{
  uint __line;
  int iVar1;
  int iVar2;
  undefined7 in_register_00000039;
  char *__assertion;
  
  iVar1 = TicFrozen;
  if ((int)CONCAT71(in_register_00000039,frozen) == 0) {
    if (TicFrozen == 0) {
      __assertion = "TicFrozen != 0";
      __line = 0x72;
      goto LAB_0032221a;
    }
    TicFrozen = 0;
    iVar2 = I_GetTimePolled(false);
    BaseTime = BaseTime + ((iVar2 - iVar1) * 1000) / 0x23;
  }
  else {
    if (TicFrozen != 0) {
      __assertion = "TicFrozen == 0";
      __line = 0x6d;
LAB_0032221a:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/posix/sdl/i_timer.cpp"
                    ,__line,"void I_FreezeTimePolled(bool)");
    }
    TicFrozen = I_GetTimePolled(false);
  }
  return;
}

Assistant:

void I_FreezeTimePolled (bool frozen)
{
	if (frozen)
	{
		assert(TicFrozen == 0);
		TicFrozen = I_GetTimePolled(false);
	}
	else
	{
		assert(TicFrozen != 0);
		int froze = TicFrozen;
		TicFrozen = 0;
		int now = I_GetTimePolled(false);
		BaseTime += (now - froze) * 1000 / TICRATE;
	}
}